

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool IsPreDescendant(Node *node)

{
  Node *local_20;
  Node *parent;
  Node *node_local;
  
  local_20 = node->parent;
  while( true ) {
    if (local_20 == (Node *)0x0) {
      return no;
    }
    if ((local_20->tag != (Dict *)0x0) && (local_20->tag->parser == prvTidyParsePre)) break;
    local_20 = local_20->parent;
  }
  return yes;
}

Assistant:

static Bool IsPreDescendant(Node* node)
{
    Node *parent = node->parent;

    while (parent)
    {
        if (parent->tag && parent->tag->parser == TY_(ParsePre))
            return yes;

        parent = parent->parent;
    }

    return no;
}